

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CreateSurrogatePairAtom
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,char16 lower,char16 upper)

{
  undefined1 *puVar1;
  MatchLiteralNode *deferredLiteralNode;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  undefined1 auVar2 [16];
  Node local_c0;
  undefined8 local_88;
  undefined1 local_80;
  Node local_78;
  undefined8 local_40;
  undefined1 local_38;
  
  deferredLiteralNode =
       (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
  (deferredLiteralNode->super_Node).tag = MatchLiteral;
  (deferredLiteralNode->super_Node).features = 0;
  puVar1 = &(deferredLiteralNode->super_Node).field_0xc;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
  (deferredLiteralNode->super_Node).firstSet = (CharSet<char16_t> *)0x0;
  (deferredLiteralNode->super_Node).followSet = (CharSet<char16_t> *)0x0;
  (deferredLiteralNode->super_Node).prevConsumes.lower = 0;
  *(undefined8 *)&(deferredLiteralNode->super_Node).prevConsumes.upper = 0xffffffff;
  *(undefined8 *)&(deferredLiteralNode->super_Node).thisConsumes.upper = 0xffffffff;
  (deferredLiteralNode->super_Node).followConsumes.upper = 0xffffffff;
  (deferredLiteralNode->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542930;
  deferredLiteralNode->isEquivClass = false;
  deferredLiteralNode->offset = 0;
  deferredLiteralNode->length = 0;
  local_c0.tag = MatchChar;
  local_c0._10_8_ = 0;
  local_c0.firstSet._2_2_ = 0;
  local_c0._20_6_ = 0;
  local_c0.followSet._2_2_ = 0;
  local_c0._28_8_ = 0;
  local_c0.prevConsumes.upper = 0xffffffff;
  local_c0.thisConsumes.lower = 0;
  local_c0.thisConsumes.upper = 0xffffffff;
  local_c0.followConsumes.lower = 0;
  local_c0.followConsumes.upper = 0xffffffff;
  local_c0._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
  local_80 = 0;
  auVar2 = ZEXT416((uint)CONCAT62(in_register_00000032,lower));
  auVar2 = pshuflw(auVar2,auVar2,0);
  local_88 = auVar2._0_8_;
  local_78.tag = MatchChar;
  local_78._10_8_ = 0;
  local_78.firstSet._2_2_ = 0;
  local_78._20_6_ = 0;
  local_78.followSet._2_2_ = 0;
  local_78._28_8_ = 0;
  local_78.prevConsumes.upper = 0xffffffff;
  local_78.thisConsumes.lower = 0;
  local_78.thisConsumes.upper = 0xffffffff;
  local_78.followConsumes.lower = 0;
  local_78.followConsumes.upper = 0xffffffff;
  local_78._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
  local_38 = 0;
  auVar2 = ZEXT416((uint)CONCAT62(in_register_00000012,upper));
  auVar2 = pshuflw(auVar2,auVar2,0);
  local_40 = auVar2._0_8_;
  AccumLiteral(this,deferredLiteralNode,&local_c0);
  AccumLiteral(this,deferredLiteralNode,&local_78);
  return &deferredLiteralNode->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CreateSurrogatePairAtom(char16 lower, char16 upper)
    {
        MatchLiteralNode * literalNode = Anew(this->ctAllocator, MatchLiteralNode, 0, 0);
        MatchCharNode lowerNode(lower);
        MatchCharNode upperNode(upper);
        AccumLiteral(literalNode, &lowerNode);
        AccumLiteral(literalNode, &upperNode);

        return literalNode;
    }